

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void R_CreatePlayerTranslation
               (float h,float s,float v,FPlayerColorSet *colorset,FPlayerSkin *skin,
               FRemapTable *table,FRemapTable *alttable,FRemapTable *pillartable)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  BYTE BVar4;
  int iVar5;
  long lVar6;
  FMemLump FVar7;
  ulong uVar8;
  long lVar9;
  PalEntry *__src;
  PalEntry *__dest;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  DWORD *pDVar13;
  bool bVar14;
  int g_00;
  float fVar15;
  float in_XMM1_Db;
  float v_00;
  float in_XMM2_Db;
  float b;
  float g;
  float r;
  float local_c4;
  float local_c0;
  float s_local;
  ulong local_b8;
  FRemapTable *local_b0;
  float local_a4;
  float fg;
  float fr;
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  float ph;
  float local_70;
  float pv;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  FRemapTable *local_40;
  float ps;
  
  bVar10 = skin->range0start;
  uVar8 = (ulong)bVar10;
  bVar1 = skin->range0end;
  s_local = s;
  local_c0 = v;
  local_c4 = h;
  local_b0 = alttable;
  local_98 = v;
  fStack_94 = in_XMM2_Db;
  local_88 = s;
  fStack_84 = in_XMM1_Db;
  if (skin->othergame == false) {
    for (lVar6 = 0; lVar9 = (long)table->NumEntries, lVar6 < lVar9; lVar6 = lVar6 + 1) {
      table->Remap[lVar6] = (BYTE)lVar6;
    }
    __dest = table->Palette;
    __src = GPalette.BaseColors;
  }
  else {
    memcpy(table->Remap,OtherGameSkinRemap,(long)table->NumEntries);
    __dest = table->Palette;
    lVar9 = (long)table->NumEntries;
    __src = OtherGameSkinPalette;
  }
  memcpy(__dest,__src,lVar9 << 2);
  for (lVar6 = 1; lVar6 < table->NumEntries; lVar6 = lVar6 + 1) {
    table->Palette[lVar6].field_0.field_0.a = 0xff;
  }
  if (bVar1 == 0 && bVar10 == 0) {
    table->Inactive = true;
    if (table->Native == (FNativePalette *)0x0) {
      return;
    }
    (*table->Native->_vptr_FNativePalette[2])();
    return;
  }
  table->Inactive = false;
  if (colorset != (FPlayerColorSet *)0x0) {
    if (colorset->Lump < 0) {
LAB_00352072:
      bVar14 = SetRange(table,(uint)bVar10,(uint)bVar1,(uint)colorset->FirstColor,
                        (uint)colorset->LastColor);
      for (uVar8 = 0; uVar8 < colorset->NumExtraRanges; uVar8 = uVar8 + 1) {
        bVar3 = SetRange(table,(uint)colorset->Extra[uVar8].RangeStart,
                         (uint)colorset->Extra[uVar8].RangeEnd,
                         (uint)colorset->Extra[uVar8].FirstColor,
                         (uint)colorset->Extra[uVar8].LastColor);
        bVar14 = (bool)(bVar14 & bVar3);
      }
    }
    else {
      iVar5 = FWadCollection::LumpLength(&Wads,colorset->Lump);
      if (iVar5 < 0x100) goto LAB_00351dfe;
      if (colorset->Lump < 0) goto LAB_00352072;
      FWadCollection::ReadLump((FWadCollection *)&ph,0x1c6a4b0);
      FVar7.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
      if (*(int *)((long)_ph + -0xc) != 0) {
        FVar7.Block.Chars = _ph;
      }
      bVar14 = true;
      for (; uVar8 <= bVar1; uVar8 = uVar8 + 1) {
        table->Remap[uVar8] = GPalette.Remap[*(byte *)((long)FVar7.Block.Chars + uVar8)];
        bVar14 = bVar14 != false && uVar8 == *(byte *)((long)FVar7.Block.Chars + uVar8);
        table->Palette[uVar8].field_0 = GPalette.BaseColors[table->Remap[uVar8]].field_0;
        table->Palette[uVar8].field_0.field_0.a = 0xff;
      }
      FMemLump::~FMemLump((FMemLump *)&ph);
    }
    table->Inactive = bVar14;
    bVar2 = 1;
    goto LAB_00352495;
  }
LAB_00351dfe:
  fVar15 = (float)(int)(((uint)bVar1 - (uint)bVar10) + 1);
  uVar11 = (uint)bVar1;
  local_b8 = uVar8;
  if ((gameinfo.gametype & GAME_DoomStrifeChex) == GAME_Any) {
    if (gameinfo.gametype != GAME_Hexen) {
      if (gameinfo.gametype == GAME_Heretic) {
        local_58 = (DWORD *)CONCAT44(local_58._4_4_,local_98 + -0.2352937);
        local_68 = 1.0 / fVar15;
        local_40 = pillartable;
        for (iVar5 = 0; uVar12 = (int)local_b8 + iVar5, uVar12 <= uVar11; iVar5 = iVar5 + 1) {
          local_c0 = (float)iVar5 * 0.418916 * local_68 + (float)local_58;
          if (1.0 <= local_c0) {
            local_c0 = 1.0;
          }
          if (local_c0 <= 0.0) {
            local_c0 = 0.0;
          }
          HSVtoRGB(&r,&g,&b,local_c4,local_88,local_c0);
          SetRemap(table,uVar12,r,g,b);
        }
        if (local_b0 == (FRemapTable *)0x0) goto LAB_00352490;
        local_88 = local_88 * 1.3;
        if (1.0 <= local_88) {
          local_88 = 1.0;
        }
        local_98 = local_98 * 1.3;
        if (1.0 <= local_98) {
          local_98 = 1.0;
        }
        pDVar13 = (DWORD *)0x0;
        while (bVar10 = (byte)local_b8, pDVar13 != (DWORD *)0x18) {
          s_local = (float)((int)pDVar13 + -0x10) * -0.0962 + 0.8965;
          if (local_88 <= s_local) {
            s_local = local_88;
          }
          local_58 = (DWORD *)((long)pDVar13 + 1);
          local_c0 = ((float)(int)local_58 * 0.0489 + 0.2102) * local_98;
          if (1.0 <= local_c0) {
            local_c0 = 1.0;
          }
          local_70 = local_c0;
          local_68 = s_local;
          HSVtoRGB(&r,&g,&b,local_c4,s_local,local_c0);
          SetRemap(local_b0,(int)pDVar13 + 0x91,r,g,b);
          fr = (float)GPalette.BaseColors[(long)pDVar13 + 0x91].field_0.field_0.r * 0.003921569;
          fg = (float)GPalette.BaseColors[(long)pDVar13 + 0x91].field_0.field_0.g * 0.003921569;
          local_a4 = (float)GPalette.BaseColors[(long)pDVar13 + 0x91].field_0.field_0.b *
                     0.003921569;
          RGBtoHSV(fr,fg,local_a4,&ph,&ps,&pv);
          HSVtoRGB(&fr,&fg,&local_a4,local_c4,local_68,pv * 0.8 + local_70 * 0.2);
          iVar5 = (int)(fr * 255.0);
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          g_00 = (int)(fg * 255.0);
          if (0xfe < g_00) {
            g_00 = 0xff;
          }
          if (g_00 < 1) {
            g_00 = 0;
          }
          uVar11 = (uint)(local_a4 * 255.0);
          if (0xfe < (int)uVar11) {
            uVar11 = 0xff;
          }
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          BVar4 = FColorMatcher::Pick(&ColorMatcher,iVar5,g_00,uVar11);
          (local_40->Remap + 0x91)[(long)pDVar13] = BVar4;
          local_40->Palette[(long)pDVar13 + 0x91].field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               (g_00 << 8 | iVar5 << 0x10 | uVar11 | 0xff000000);
          pDVar13 = local_58;
        }
        if (local_b0->Native != (FNativePalette *)0x0) {
          (*local_b0->Native->_vptr_FNativePalette[2])();
        }
      }
      bVar2 = 0;
      goto LAB_00352495;
    }
    local_c0 = 0.1;
    if (0.1 <= local_98) {
      local_c0 = local_98;
    }
    if (sprites.Array[skin->sprite].field_0.dwName == 0x59414c50) {
      iVar5 = 0;
      while (uVar12 = (uint)uVar8, uVar12 <= uVar11) {
        HSVtoRGB(&r,&g,&b,local_c4,local_88,
                 *(float *)(&DAT_005b02a0 + (long)(iVar5 / (int)fVar15) * 4) * local_98);
        SetRemap(table,uVar12,r,g,b);
        iVar5 = iVar5 + 9;
        uVar8 = (ulong)(uVar12 + 1);
      }
    }
    else {
      iVar5 = 0;
      while (uVar12 = (uint)uVar8, uVar12 <= uVar11) {
        lVar6 = (long)(iVar5 / (int)fVar15);
        HSVtoRGB(&r,&g,&b,local_c4,*(float *)(&DAT_005b02d0 + lVar6 * 4) * local_88,
                 *(float *)(&DAT_005b0320 + lVar6 * 4) * local_98);
        SetRemap(table,uVar12,r,g,b);
        iVar5 = iVar5 + 0x12;
        uVar8 = (ulong)(uVar12 + 1);
      }
    }
  }
  else {
    s_local = local_88 + -0.23;
    local_c0 = local_98 + 0.1;
    fStack_84 = fStack_84 + 0.0;
    fStack_94 = fStack_94 + 0.0;
    fVar15 = 1.0 / fVar15;
    local_68 = fVar15 * 0.23;
    fStack_64 = fVar15 * 0.94112;
    fStack_60 = fVar15 * 0.0;
    fStack_5c = fVar15 * 0.0;
    for (uVar12 = (uint)bVar10; uVar12 <= uVar11; uVar12 = uVar12 + 1) {
      fVar15 = s_local;
      if (1.0 <= s_local) {
        fVar15 = 1.0;
      }
      if (fVar15 <= 0.0) {
        fVar15 = 0.0;
      }
      local_58 = (DWORD *)CONCAT44(local_c0,s_local);
      v_00 = local_c0;
      if (1.0 <= local_c0) {
        v_00 = 1.0;
      }
      if (v_00 <= 0.0) {
        v_00 = 0.0;
      }
      fStack_50 = fStack_84;
      fStack_4c = fStack_94;
      HSVtoRGB(&r,&g,&b,local_c4,fVar15,v_00);
      SetRemap(table,uVar12,r,g,b);
      s_local = (float)local_58 + local_68;
      fStack_84 = fStack_50 + fStack_60;
      fStack_94 = fStack_4c + fStack_5c;
      local_c0 = local_58._4_4_ - fStack_64;
    }
  }
LAB_00352490:
  bVar2 = 0;
  bVar10 = (byte)local_b8;
LAB_00352495:
  if ((local_b0 != (FRemapTable *)0x0) && (gameinfo.gametype == GAME_Hexen)) {
    if ((bool)(bVar2 & bVar10 == 0xa4 & bVar1 == 0xb9)) {
      FRemapTable::operator=(local_b0,table);
    }
    else {
      for (lVar6 = 0xa4; lVar6 != 0xba; lVar6 = lVar6 + 1) {
        RGBtoHSV((float)GPalette.BaseColors[lVar6].field_0.field_0.r * 0.003921569,
                 (float)GPalette.BaseColors[lVar6].field_0.field_0.g * 0.003921569,
                 (float)GPalette.BaseColors[lVar6].field_0.field_0.b * 0.003921569,&ph,&s_local,
                 &local_c0);
        HSVtoRGB(&r,&g,&b,local_c4,s_local * local_88,local_c0 * local_98);
        SetRemap(local_b0,(int)lVar6,r,g,b);
      }
    }
    if (local_b0->Native != (FNativePalette *)0x0) {
      (*local_b0->Native->_vptr_FNativePalette[2])();
    }
  }
  if (table->Native != (FNativePalette *)0x0) {
    (*table->Native->_vptr_FNativePalette[2])();
  }
  return;
}

Assistant:

static void R_CreatePlayerTranslation (float h, float s, float v, const FPlayerColorSet *colorset,
	FPlayerSkin *skin, FRemapTable *table, FRemapTable *alttable, FRemapTable *pillartable)
{
	int i;
	BYTE start = skin->range0start;
	BYTE end = skin->range0end;
	float r, g, b;
	float bases, basev;
	float sdelta, vdelta;
	float range;

	// Set up the base translation for this skin. If the skin was created
	// for the current game, then this is just an identity translation.
	// Otherwise, it remaps the colors from the skin's original palette to
	// the current one.
	if (skin->othergame)
	{
		memcpy (table->Remap, OtherGameSkinRemap, table->NumEntries);
		memcpy (table->Palette, OtherGameSkinPalette, sizeof(*table->Palette) * table->NumEntries);
	}
	else
	{
		for (i = 0; i < table->NumEntries; ++i)
		{
			table->Remap[i] = i;
		}
		memcpy(table->Palette, GPalette.BaseColors, sizeof(*table->Palette) * table->NumEntries);
	}
	for (i = 1; i < table->NumEntries; ++i)
	{
		table->Palette[i].a = 255;
	}

	// [GRB] Don't translate skins with color range 0-0 (APlayerPawn default)
	if (start == 0 && end == 0)
	{
		table->Inactive = true;
		table->UpdateNative();
		return;
	}

	table->Inactive = false;
	range = (float)(end-start+1);

	bases = s;
	basev = v;

	if (colorset != NULL && colorset->Lump >= 0 && Wads.LumpLength(colorset->Lump) < 256)
	{ // Bad table length. Ignore it.
		colorset = NULL;
	}

	if (colorset != NULL)
	{
		bool identity = true;
		// Use the pre-defined range instead of a custom one.
		if (colorset->Lump < 0)
		{
			identity &= SetRange(table, start, end, colorset->FirstColor, colorset->LastColor);
			for (i = 0; i < colorset->NumExtraRanges; ++i)
			{
				identity &= SetRange(table,
					colorset->Extra[i].RangeStart, colorset->Extra[i].RangeEnd,
					colorset->Extra[i].FirstColor, colorset->Extra[i].LastColor);
			}
		}
		else
		{
			FMemLump translump = Wads.ReadLump(colorset->Lump);
			const BYTE *trans = (const BYTE *)translump.GetMem();
			for (i = start; i <= end; ++i)
			{
				table->Remap[i] = GPalette.Remap[trans[i]];
				identity &= (trans[i] == i);
				table->Palette[i] = GPalette.BaseColors[table->Remap[i]];
				table->Palette[i].a = 255;
			}
		}
		// If the colorset created an identity translation mark it as inactive
		table->Inactive = identity;
	}
	else if (gameinfo.gametype & GAME_DoomStrifeChex)
	{
		// Build player sprite translation
		s -= 0.23f;
		v += 0.1f;
		sdelta = 0.23f / range;
		vdelta = -0.94112f / range;

		for (i = start; i <= end; i++)
		{
			float uses, usev;
			uses = clamp (s, 0.f, 1.f);
			usev = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, uses, usev);
			SetRemap(table, i, r, g, b);
			s += sdelta;
			v += vdelta;
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		float vdelta = 0.418916f / range;

		// Build player sprite translation
		for (i = start; i <= end; i++)
		{
			v = vdelta * (float)(i - start) + basev - 0.2352937f;
			v = clamp (v, 0.f, 1.f);
			HSVtoRGB (&r, &g, &b, h, s, v);
			SetRemap(table, i, r, g, b);
		}

		// Build rain/lifegem translation
		if (alttable)
		{
			bases = MIN (bases*1.3f, 1.f);
			basev = MIN (basev*1.3f, 1.f);
			for (i = 145; i <= 168; i++)
			{
				s = MIN (bases, 0.8965f - 0.0962f*(float)(i - 161));
				v = MIN (1.f, (0.2102f + 0.0489f*(float)(i - 144)) * basev);
				HSVtoRGB (&r, &g, &b, h, s, v);
				SetRemap(alttable, i, r, g, b);
				SetPillarRemap(pillartable, i, h, s, v);
			}
			alttable->UpdateNative();
		}
	}
	else if (gameinfo.gametype == GAME_Hexen)
	{
		if (memcmp (sprites[skin->sprite].name, "PLAY", 4) == 0)
		{ // The fighter is different! He gets a brown hairy loincloth, but the other
		  // two have blue capes.
			float vs[9] = { .28f, .32f, .38f, .42f, .47f, .5f, .58f, .71f, .83f };

			// Build player sprite translation
			//h = 45.f;
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, s, vs[(i-start)*9/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
		else
		{
			float ms[18] = { .95f, .96f, .89f, .97f, .97f, 1.f, 1.f, 1.f, .97f, .99f, .87f, .77f, .69f, .62f, .57f, .47f, .43f };
			float mv[18] = { .16f, .19f, .22f, .25f, .31f, .35f, .38f, .41f, .47f, .54f, .60f, .65f, .71f, .77f, .83f, .89f, .94f, 1.f };

			// Build player sprite translation
			v = MAX (0.1f, v);

			for (i = start; i <= end; i++)
			{
				HSVtoRGB (&r, &g, &b, h, ms[(i-start)*18/(int)range]*bases, mv[(i-start)*18/(int)range]*basev);
				SetRemap(table, i, r, g, b);
			}
		}
	}
	if (gameinfo.gametype == GAME_Hexen && alttable != NULL)
	{
		// Build Hexen's lifegem translation.
		
		// Is the player's translation range the same as the gem's and we are using a
		// predefined translation? If so, then use the same one for the gem. Otherwise,
		// build one as per usual.
		if (colorset != NULL && start == 164 && end == 185)
		{
			*alttable = *table;
		}
		else
		{
			for (i = 164; i <= 185; ++i)
			{
				const PalEntry *base = &GPalette.BaseColors[i];
				float dummy;

				RGBtoHSV (base->r/255.f, base->g/255.f, base->b/255.f, &dummy, &s, &v);
				HSVtoRGB (&r, &g, &b, h, s*bases, v*basev);
				SetRemap(alttable, i, r, g, b);
			}
		}
		alttable->UpdateNative();
	}
	table->UpdateNative();
}